

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::String::String(String *this,char *in)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (in == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = in + -1;
    pcVar2 = in;
    do {
      pcVar3 = pcVar3 + 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  pcVar3 = (char *)malloc((size_t)(pcVar3 + (1 - (long)in)));
  this->m_str = pcVar3;
  if (in == (char *)0x0) {
    *pcVar3 = '\0';
    return;
  }
  strcpy(pcVar3,in);
  return;
}

Assistant:

String::String(const char* in)
        : m_str(static_cast<char*>(malloc(detail::my_strlen(in) + 1))) {
    if(in)
        strcpy(m_str, in);
    else
        m_str[0] = '\0';
}